

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O1

void __thiscall
gimage::HighDynamicRangeFusion<unsigned_char>::add
          (HighDynamicRangeFusion<unsigned_char> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,float max_value,int id,
          uint64_t timestamp,bool replace_id)

{
  vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
  *this_00;
  pointer psVar1;
  pointer pIVar2;
  ImageFloat *wp;
  float *pfVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  pointer psVar6;
  invalid_argument *this_01;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  shared_ptr<gimage::HighDynamicRangeFusionBase::Data> p;
  value_type local_40;
  
  psVar6 = (this->super_HighDynamicRangeFusionBase).list.
           super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->super_HighDynamicRangeFusionBase).list.
           super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)psVar1 - (long)psVar6;
  if ((lVar7 != 0) &&
     (((pIVar2 = (((psVar6->
                   super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->laplace).
                 super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, pIVar2->width != image->width ||
       (pIVar2->height != image->height)) || (pIVar2->depth != image->depth)))) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"HighDynamicRangeFusion::add(): All images must have same size and depth");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar10 = 0xffffffff;
  if (psVar1 != psVar6 && -1 < id) {
    uVar8 = 1;
    do {
      uVar5 = (int)uVar8 - 1;
      if (((psVar6->
           super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr)->id != id) {
        uVar5 = uVar10;
      }
      uVar10 = uVar5;
      if ((ulong)(lVar7 >> 4) <= uVar8) break;
      uVar8 = uVar8 + 1;
      psVar6 = psVar6 + 1;
    } while ((int)uVar10 < 0);
  }
  if ((int)uVar10 < 0 || replace_id) {
    this_00 = &(this->super_HighDynamicRangeFusionBase).list;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)
           (local_40.
            super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi + 1);
    (local_40.
     super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count = 1;
    (local_40.
     super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_weak_count = 1;
    (local_40.
     super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_0015f868;
    *(int *)&local_40.
             super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi[1]._vptr__Sp_counted_base = id;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._M_use_count = (int)timestamp;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._M_weak_count = (int)(timestamp >> 0x20);
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_use_count = 0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_weak_count = 0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._M_use_count = 0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._M_weak_count = 0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._M_use_count = 0;
    local_40.
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._M_weak_count = 0;
    if ((int)uVar10 < 0) {
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::push_back(this_00,&local_40);
    }
    else {
      psVar6 = (this_00->
               super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar10;
      (psVar6->
      super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = local_40.
               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(psVar6->
                  super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,
                 &local_40.
                  super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    createLaplacianPyramid<unsigned_char>
              (&(local_40.
                 super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->laplace,image);
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::resize(&(local_40.
               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->weight,
             ((long)((local_40.
                      super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->laplace).
                    super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)((local_40.
                      super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->laplace).
                    super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    Image<float,_gimage::PixelTraits<float>_>::setSize
              (((local_40.
                 super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->weight).
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,image->width,image->height,1);
    auVar4 = _DAT_0014f180;
    wp = ((local_40.
           super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->weight).
         super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (this->contrast == true) {
      HighDynamicRangeFusionBase::setContrastWeight
                (&this->super_HighDynamicRangeFusionBase,wp,
                 ((local_40.
                   super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->laplace).
                 super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,max_value);
    }
    else {
      lVar7 = wp->n;
      if (lVar7 != 0) {
        lVar9 = -lVar7;
        if (0 < lVar7) {
          lVar9 = lVar7;
        }
        pfVar3 = wp->pixel;
        lVar7 = lVar9 + -1;
        auVar11._8_4_ = (int)lVar7;
        auVar11._0_8_ = lVar7;
        auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar8 = 0;
        auVar11 = auVar11 ^ _DAT_0014f180;
        auVar13 = _DAT_0014f160;
        auVar14 = _DAT_0014f170;
        do {
          auVar15 = auVar14 ^ auVar4;
          iVar12 = auVar11._4_4_;
          if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                      iVar12 < auVar15._4_4_) & 1)) {
            pfVar3[uVar8] = 1.0;
          }
          if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
              auVar15._12_4_ <= auVar11._12_4_) {
            pfVar3[uVar8 + 1] = 1.0;
          }
          auVar15 = auVar13 ^ auVar4;
          iVar16 = auVar15._4_4_;
          if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
            pfVar3[uVar8 + 2] = 1.0;
            pfVar3[uVar8 + 3] = 1.0;
          }
          uVar8 = uVar8 + 4;
          lVar7 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 4;
          auVar14._8_8_ = lVar7 + 4;
          lVar7 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 4;
          auVar13._8_8_ = lVar7 + 4;
        } while ((lVar9 + 3U & 0xfffffffffffffffc) != uVar8);
      }
    }
    if (this->well_exposedness == true) {
      mulWellExposednessWeight
                (this,((local_40.
                        super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->weight).
                      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,image,max_value);
    }
    if ((this->saturation == true) && (1 < image->depth)) {
      mulSaturationWeight(this,((local_40.
                                 super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->weight).
                               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,image,max_value);
    }
    if (local_40.
        super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.
                 super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void add(const Image<T> &image, float max_value=255, int id=-1, uint64_t timestamp=0,
      bool replace_id=true)
    {
      // check that image has same size and depth as previous images

      if (list.size() > 0 && (list[0]->laplace[0].getWidth() != image.getWidth() ||
          list[0]->laplace[0].getHeight() != image.getHeight() ||
          list[0]->laplace[0].getDepth() != image.getDepth()))
      {
        throw std::invalid_argument("HighDynamicRangeFusion::add(): All images must have same size and depth");
      }

      // find existing data set with the same id

      int k=-1;
      if (id >= 0)
      {
        for (size_t i=0; i<list.size() && k < 0; i++)
        {
          if (list[i]->id == id)
          {
            k=static_cast<int>(i);
          }
        }
      }

      if (k >= 0 && !replace_id)
      {
        return;
      }

      // add, replace or skip data set, depending on the id and replace_id

      std::shared_ptr<Data> p=std::make_shared<Data>(id, timestamp);

      if (k >= 0)
      {
        list[k]=p;
      }
      else
      {
        list.push_back(p);
      }

      // create Laplace pyramid from image

      createLaplacianPyramid(p->laplace, image);

      // compute weights for highest resolution

      p->weight.resize(p->laplace.size());
      p->weight[0].setSize(image.getWidth(), image.getHeight(), 1);

      // weight according to local contrast

      if (contrast)
      {
        setContrastWeight(p->weight[0], p->laplace[0], max_value);
      }
      else
      {
        p->weight[0]=1;
      }

      // weight according to exposedness, i.e. not under- or overexposed

      if (well_exposedness)
      {
        mulWellExposednessWeight(p->weight[0], image, max_value);
      }

      // if color image, weight according to saturation

      if (saturation && image.getDepth() > 1)
      {
        mulSaturationWeight(p->weight[0], image, max_value);
      }
    }